

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

int gcd(uint32_t *data,size_t n)

{
  uint uVar1;
  ulong local_38;
  size_t i;
  uint32_t gcd;
  uint32_t temp;
  uint32_t x;
  size_t n_local;
  uint32_t *data_local;
  
  if (n == 0) {
    data_local._4_4_ = 1;
  }
  else {
    i._4_4_ = *data;
    for (local_38 = 1; local_38 < n; local_38 = local_38 + 1) {
      gcd = data[local_38];
      while (gcd != 0) {
        uVar1 = gcd;
        gcd = i._4_4_ % gcd;
        i._4_4_ = uVar1;
      }
    }
    data_local._4_4_ = i._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static inline int gcd(uint32_t const *data, size_t n)
{
    if (n == 0)
    {
        return 1;
    }
    uint32_t x, temp, gcd = data[0];
    for (size_t i = 1; i < n; ++i)
    {
        x = data[i];
        while (x != 0)
        {
            temp = x;
            x = gcd % x;
            gcd = temp;
        }
    }
    return gcd;
}